

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenGlobalSet(BinaryenModuleRef module,char *name,BinaryenExpressionRef value)

{
  GlobalSet *pGVar1;
  string_view local_38;
  Builder local_28;
  BinaryenExpressionRef local_20;
  BinaryenExpressionRef value_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  local_20 = value;
  value_local = (BinaryenExpressionRef)name;
  name_local = (char *)module;
  wasm::Builder::Builder(&local_28,module);
  wasm::Name::Name((Name *)&local_38,(char *)value_local);
  pGVar1 = wasm::Builder::makeGlobalSet(&local_28,(Name)local_38,local_20);
  return (BinaryenExpressionRef)pGVar1;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalSet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalSet(name, (Expression*)value));
}